

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

AddBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_addbroadcastable(NeuralNetworkLayer *this)

{
  bool bVar1;
  AddBroadcastableLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_addbroadcastable(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_addbroadcastable(this);
    this_00 = (AddBroadcastableLayerParams *)operator_new(0x18);
    AddBroadcastableLayerParams::AddBroadcastableLayerParams(this_00);
    (this->layer_).addbroadcastable_ = this_00;
  }
  return (AddBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AddBroadcastableLayerParams* NeuralNetworkLayer::mutable_addbroadcastable() {
  if (!has_addbroadcastable()) {
    clear_layer();
    set_has_addbroadcastable();
    layer_.addbroadcastable_ = new ::CoreML::Specification::AddBroadcastableLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.addBroadcastable)
  return layer_.addbroadcastable_;
}